

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

void __thiscall
Js::CustomExternalWrapperObject::SetPrototype
          (CustomExternalWrapperObject *this,RecyclableObject *newPrototype)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var aValue;
  RecyclableObject *newPrototype_00;
  RecyclableObject *newPrototype_local;
  CustomExternalWrapperObject *this_local;
  
  BVar1 = VerifyObjectAlive(this);
  if (BVar1 != 0) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    aValue = CrossSite::MarshalVar(scriptContext,newPrototype,false);
    newPrototype_00 = VarTo<Js::RecyclableObject>(aValue);
    DynamicObject::SetPrototype(&this->super_DynamicObject,newPrototype_00);
  }
  return;
}

Assistant:

void CustomExternalWrapperObject::SetPrototype(RecyclableObject* newPrototype)
{
    if (!this->VerifyObjectAlive())
    {
        return;
    }

    // setting the value could be deferred and now we are on a different context from
    // make sure the value has the same context as the containing object.
    newPrototype = VarTo<RecyclableObject>(Js::CrossSite::MarshalVar(this->GetScriptContext(), newPrototype));
    DynamicObject::SetPrototype(newPrototype);
}